

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O0

void __thiscall mp::NLSolution::NLSolution(NLSolution *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0xfffffffe;
  in_RDI[1] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *(undefined8 *)(in_RDI + 10) = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10bb7f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10bb8d);
  NLSuffixSet::NLSuffixSet((NLSuffixSet *)0x10bb9b);
  return;
}

Assistant:

operator bool() const { return solve_result_ > -2; }